

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O3

bool exercise_octal::test_uintwide_t_spot_values_exercise_octal(void)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  local_uint128_t u_oct;
  local_uint128_t u_dec;
  stringstream strm;
  uintwide_t<128U,_unsigned_int,_void,_false> local_1e8;
  int local_1d8 [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream local_1a0 [16];
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  local_1d8[0] = 0x35056427;
  local_1d8[1] = 0x2b8a5349;
  local_1d8[2] = 0x72c74d82;
  local_1d8[3] = 0x134261;
  local_1e8.values.super_array<unsigned_int,_4UL>.elems[0] = 0x35056427;
  local_1e8.values.super_array<unsigned_int,_4UL>.elems[1] = 0x2b8a5349;
  local_1e8.values.super_array<unsigned_int,_4UL>.elems[2] = 0x72c74d82;
  local_1e8.values.super_array<unsigned_int,_4UL>.elems[3] = 0x134261;
  lVar2 = 0xc;
  do {
    lVar4 = lVar2;
    if (lVar4 == -4) break;
    lVar2 = lVar4 + -4;
  } while (*(int *)((long)local_1d8 + lVar4) ==
           *(int *)((long)local_1e8.values.super_array<unsigned_int,_4UL>.elems + lVar4));
  std::__cxx11::stringstream::stringstream(local_1a0);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 0x200;
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 0x40;
  math::wide_integer::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_190,&local_1e8);
  std::__cxx11::stringbuf::str();
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_1c0,"0464114134543515404256122464446501262047");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return iVar3 == 0 && lVar4 == -4;
}

Assistant:

auto test_uintwide_t_spot_values_exercise_octal() -> bool
  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    constexpr local_uint128_t u_dec("100000000000000000000777772222211111");
    constexpr local_uint128_t u_oct("0464114134543515404256122464446501262047");

    auto result_conversion_is_ok = (u_dec == u_oct);

    static_assert(u_dec == u_oct, "Error: Conversion decimal to octal is not OK");

    std::stringstream strm;

    strm << std::showbase << std::oct << u_oct;

    result_conversion_is_ok = ((strm.str() == "0464114134543515404256122464446501262047") && result_conversion_is_ok);

    return result_conversion_is_ok;
  }